

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JoinVerticesProcess.cpp
# Opt level: O2

void __thiscall Assimp::JoinVerticesProcess::Execute(JoinVerticesProcess *this,aiScene *pScene)

{
  bool bVar1;
  int iVar2;
  Logger *pLVar3;
  uint a;
  int iVar4;
  uint a_1;
  ulong uVar5;
  int iVar6;
  char *local_1c8 [4];
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  
  pLVar3 = DefaultLogger::get();
  Logger::debug(pLVar3,"JoinVerticesProcess begin");
  iVar6 = 0;
  bVar1 = DefaultLogger::isNullLogger();
  iVar4 = 0;
  if (!bVar1) {
    iVar4 = 0;
    for (uVar5 = 0; pScene->mNumMeshes != uVar5; uVar5 = uVar5 + 1) {
      iVar4 = iVar4 + pScene->mMeshes[uVar5]->mNumVertices;
    }
  }
  for (uVar5 = 0; uVar5 < pScene->mNumMeshes; uVar5 = uVar5 + 1) {
    iVar2 = ProcessMesh(this,pScene->mMeshes[uVar5],(uint)uVar5);
    iVar6 = iVar6 + iVar2;
  }
  bVar1 = DefaultLogger::isNullLogger();
  if (!bVar1) {
    pLVar3 = DefaultLogger::get();
    if (iVar4 - iVar6 == 0) {
      Logger::debug(pLVar3,"JoinVerticesProcess finished ");
    }
    else {
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      basic_formatter<char[42]>
                (&local_1a8,(char (*) [42])"JoinVerticesProcess finished | Verts in: ");
      std::ostream::operator<<(&local_1a8,iVar4);
      std::operator<<((ostream *)&local_1a8," out: ");
      std::ostream::operator<<(&local_1a8,iVar6);
      std::operator<<((ostream *)&local_1a8," | ~");
      std::ostream::operator<<(&local_1a8,((float)(iVar4 - iVar6) / (float)iVar4) * 100.0);
      std::__cxx11::stringbuf::str();
      Logger::info(pLVar3,local_1c8[0]);
      std::__cxx11::string::~string((string *)local_1c8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
    }
  }
  *(byte *)&pScene->mFlags = (byte)pScene->mFlags | 8;
  return;
}

Assistant:

void JoinVerticesProcess::Execute( aiScene* pScene)
{
    ASSIMP_LOG_DEBUG("JoinVerticesProcess begin");

    // get the total number of vertices BEFORE the step is executed
    int iNumOldVertices = 0;
    if (!DefaultLogger::isNullLogger()) {
        for( unsigned int a = 0; a < pScene->mNumMeshes; a++)   {
            iNumOldVertices +=  pScene->mMeshes[a]->mNumVertices;
        }
    }

    // execute the step
    int iNumVertices = 0;
    for( unsigned int a = 0; a < pScene->mNumMeshes; a++)
        iNumVertices += ProcessMesh( pScene->mMeshes[a],a);

    // if logging is active, print detailed statistics
    if (!DefaultLogger::isNullLogger()) {
        if (iNumOldVertices == iNumVertices) {
            ASSIMP_LOG_DEBUG("JoinVerticesProcess finished ");
        } else {
            ASSIMP_LOG_INFO_F("JoinVerticesProcess finished | Verts in: ", iNumOldVertices,
                " out: ", iNumVertices, " | ~",
                ((iNumOldVertices - iNumVertices) / (float)iNumOldVertices) * 100.f );
        }
    }

    pScene->mFlags |= AI_SCENE_FLAGS_NON_VERBOSE_FORMAT;
}